

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INumberJudger.cpp
# Opt level: O0

bool __thiscall INumberJudger::isNumber(INumberJudger *this,string *s)

{
  initializer_list<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_> __l;
  initializer_list<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_> __l_00;
  initializer_list<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_> __l_01;
  initializer_list<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_> __l_02;
  initializer_list<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_> __l_03;
  initializer_list<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_> __l_04;
  initializer_list<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_> __l_05;
  initializer_list<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_> __l_06;
  initializer_list<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_> __l_07;
  initializer_list<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_> __l_08;
  initializer_list<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>
  __l_09;
  bool bVar1;
  char *pcVar2;
  mapped_type *pmVar3;
  CharType *pCVar4;
  bool local_891;
  pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
  *local_820;
  _Node_iterator_base<std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_false>
  local_760;
  _Node_iterator_base<std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_false>
  local_758;
  CharType local_750;
  int local_74c;
  CharType typ;
  int i;
  State st;
  int len;
  State local_738;
  CharType local_734;
  pair<const_INumberJudger::CharType,_INumberJudger::State> local_730;
  iterator local_728;
  size_type local_720;
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  local_718;
  State local_6e0;
  allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_> local_6db;
  key_equal local_6da;
  hasher local_6d9;
  State local_6d8;
  CharType local_6d4;
  State local_6d0;
  CharType local_6cc;
  pair<const_INumberJudger::CharType,_INumberJudger::State> local_6c8;
  pair<const_INumberJudger::CharType,_INumberJudger::State> local_6c0;
  iterator local_6b8;
  size_type local_6b0;
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  local_6a8;
  State local_670;
  allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_> local_66b;
  key_equal local_66a;
  hasher local_669;
  State local_668;
  CharType local_664;
  pair<const_INumberJudger::CharType,_INumberJudger::State> local_660;
  iterator local_658;
  size_type local_650;
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  local_648;
  State local_610;
  allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_> local_60b;
  key_equal local_60a;
  hasher local_609;
  State local_608;
  CharType local_604;
  State local_600;
  CharType local_5fc;
  pair<const_INumberJudger::CharType,_INumberJudger::State> local_5f8;
  pair<const_INumberJudger::CharType,_INumberJudger::State> local_5f0;
  iterator local_5e8;
  size_type local_5e0;
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  local_5d8;
  State local_5a0;
  allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_> local_59b;
  key_equal local_59a;
  hasher local_599;
  pair<const_INumberJudger::CharType,_INumberJudger::State> local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  iterator local_578;
  size_type local_570;
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  local_568;
  State local_530;
  allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_> local_52b;
  key_equal local_52a;
  hasher local_529;
  State local_528;
  CharType local_524;
  pair<const_INumberJudger::CharType,_INumberJudger::State> local_520;
  iterator local_518;
  size_type local_510;
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  local_508;
  State local_4d0;
  allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_> local_4cb;
  key_equal local_4ca;
  hasher local_4c9;
  pair<const_INumberJudger::CharType,_INumberJudger::State> local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  iterator local_4a8;
  size_type local_4a0;
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  local_498;
  State local_460;
  allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_> local_45b;
  key_equal local_45a;
  hasher local_459;
  pair<const_INumberJudger::CharType,_INumberJudger::State> local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  iterator local_438;
  size_type local_430;
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  local_428;
  State local_3f0;
  allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_> local_3eb;
  key_equal local_3ea;
  hasher local_3e9;
  State local_3e8;
  CharType local_3e4;
  State local_3e0;
  CharType local_3dc;
  pair<const_INumberJudger::CharType,_INumberJudger::State> local_3d8;
  pair<const_INumberJudger::CharType,_INumberJudger::State> local_3d0;
  iterator local_3c8;
  size_type local_3c0;
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  local_3b8;
  State local_380 [5];
  allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_> local_36b;
  key_equal local_36a;
  hasher local_369;
  pair<const_INumberJudger::CharType,_INumberJudger::State> local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  iterator local_340;
  size_type local_338;
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  local_330;
  State local_2f4;
  pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
  *local_2f0;
  pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
  local_2e8;
  pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
  local_2a8;
  pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
  local_268;
  pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
  local_228;
  pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
  local_1e8;
  pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
  local_1a8;
  pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
  local_168;
  pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
  local_128;
  pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
  local_e8;
  pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
  local_a8;
  iterator local_68;
  __buckets_ptr local_60;
  undefined1 local_58 [8];
  unordered_map<INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>,_std::hash<INumberJudger::State>,_std::equal_to<INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>_>
  transfer;
  string *s_local;
  INumberJudger *this_local;
  
  len._0_1_ = 1;
  local_2f0 = &local_2e8;
  local_2f4 = STATE_INITIAL;
  local_358 = 0x400000002;
  uStack_350 = 0x100000003;
  local_368.first = CHAR_SPACE;
  local_368.second = STATE_INITIAL;
  uStack_360 = 0x200000000;
  local_340 = &local_368;
  local_338 = 4;
  transfer._M_h._M_single_bucket = (__node_base_ptr)s;
  std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>::allocator
            (&local_36b);
  __l_08._M_len = local_338;
  __l_08._M_array = local_340;
  std::
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  ::unordered_map(&local_330,__l_08,0,&local_369,&local_36a,&local_36b);
  std::
  pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
  ::pair<INumberJudger::State,_true>(&local_2e8,&local_2f4,&local_330);
  local_380[0] = STATE_INT_SIGN;
  local_3dc = CHAR_NUMBER;
  local_3e0 = STATE_INTEGER;
  local_2f0 = &local_2a8;
  std::pair<const_INumberJudger::CharType,_INumberJudger::State>::
  pair<INumberJudger::CharType,_INumberJudger::State,_true>(&local_3d8,&local_3dc,&local_3e0);
  local_3e4 = CHAR_POINT;
  local_3e8 = STATE_POINT_WITHOUT_INT;
  std::pair<const_INumberJudger::CharType,_INumberJudger::State>::
  pair<INumberJudger::CharType,_INumberJudger::State,_true>(&local_3d0,&local_3e4,&local_3e8);
  local_3c8 = &local_3d8;
  local_3c0 = 2;
  std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>::allocator
            (&local_3eb);
  __l_07._M_len = local_3c0;
  __l_07._M_array = local_3c8;
  std::
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  ::unordered_map(&local_3b8,__l_07,0,&local_3e9,&local_3ea,&local_3eb);
  std::
  pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
  ::pair<INumberJudger::State,_true>(&local_2a8,local_380,&local_3b8);
  local_3f0 = STATE_INTEGER;
  local_448 = 0x300000002;
  uStack_440 = 0x900000004;
  local_458.first = CHAR_NUMBER;
  local_458.second = STATE_INTEGER;
  uStack_450 = 0x600000001;
  local_438 = &local_458;
  local_430 = 4;
  local_2f0 = &local_268;
  std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>::allocator
            (&local_45b);
  __l_06._M_len = local_430;
  __l_06._M_array = local_438;
  std::
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  ::unordered_map(&local_428,__l_06,0,&local_459,&local_45a,&local_45b);
  std::
  pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
  ::pair<INumberJudger::State,_true>(&local_268,&local_3f0,&local_428);
  local_460 = STATE_POINT;
  local_4b8 = 0x900000004;
  local_4c8.first = CHAR_NUMBER;
  local_4c8.second = STATE_FRACTION;
  uStack_4c0 = 0x600000001;
  local_4a8 = &local_4c8;
  local_4a0 = 3;
  local_2f0 = &local_228;
  std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>::allocator
            (&local_4cb);
  __l_05._M_len = local_4a0;
  __l_05._M_array = local_4a8;
  std::
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  ::unordered_map(&local_498,__l_05,0,&local_4c9,&local_4ca,&local_4cb);
  std::
  pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
  ::pair<INumberJudger::State,_true>(&local_228,&local_460,&local_498);
  local_4d0 = STATE_POINT_WITHOUT_INT;
  local_524 = CHAR_NUMBER;
  local_528 = STATE_FRACTION;
  local_2f0 = &local_1e8;
  std::pair<const_INumberJudger::CharType,_INumberJudger::State>::
  pair<INumberJudger::CharType,_INumberJudger::State,_true>(&local_520,&local_524,&local_528);
  local_518 = &local_520;
  local_510 = 1;
  std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>::allocator
            (&local_52b);
  __l_04._M_len = local_510;
  __l_04._M_array = local_518;
  std::
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  ::unordered_map(&local_508,__l_04,0,&local_529,&local_52a,&local_52b);
  std::
  pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
  ::pair<INumberJudger::State,_true>(&local_1e8,&local_4d0,&local_508);
  local_530 = STATE_FRACTION;
  local_588 = 0x900000004;
  local_598.first = CHAR_NUMBER;
  local_598.second = STATE_FRACTION;
  uStack_590 = 0x600000001;
  local_578 = &local_598;
  local_570 = 3;
  local_2f0 = &local_1a8;
  std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>::allocator
            (&local_59b);
  __l_03._M_len = local_570;
  __l_03._M_array = local_578;
  std::
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  ::unordered_map(&local_568,__l_03,0,&local_599,&local_59a,&local_59b);
  std::
  pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
  ::pair<INumberJudger::State,_true>(&local_1a8,&local_530,&local_568);
  local_5a0 = STATE_EXP;
  local_5fc = CHAR_NUMBER;
  local_600 = STATE_EXP_NUMBER;
  local_2f0 = &local_168;
  std::pair<const_INumberJudger::CharType,_INumberJudger::State>::
  pair<INumberJudger::CharType,_INumberJudger::State,_true>(&local_5f8,&local_5fc,&local_600);
  local_604 = CHAR_SIGN;
  local_608 = STATE_EXP_SIGN;
  std::pair<const_INumberJudger::CharType,_INumberJudger::State>::
  pair<INumberJudger::CharType,_INumberJudger::State,_true>(&local_5f0,&local_604,&local_608);
  local_5e8 = &local_5f8;
  local_5e0 = 2;
  std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>::allocator
            (&local_60b);
  __l_02._M_len = local_5e0;
  __l_02._M_array = local_5e8;
  std::
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  ::unordered_map(&local_5d8,__l_02,0,&local_609,&local_60a,&local_60b);
  std::
  pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
  ::pair<INumberJudger::State,_true>(&local_168,&local_5a0,&local_5d8);
  local_610 = STATE_EXP_SIGN;
  local_664 = CHAR_NUMBER;
  local_668 = STATE_EXP_NUMBER;
  local_2f0 = &local_128;
  std::pair<const_INumberJudger::CharType,_INumberJudger::State>::
  pair<INumberJudger::CharType,_INumberJudger::State,_true>(&local_660,&local_664,&local_668);
  local_658 = &local_660;
  local_650 = 1;
  std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>::allocator
            (&local_66b);
  __l_01._M_len = local_650;
  __l_01._M_array = local_658;
  std::
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  ::unordered_map(&local_648,__l_01,0,&local_669,&local_66a,&local_66b);
  std::
  pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
  ::pair<INumberJudger::State,_true>(&local_128,&local_610,&local_648);
  local_670 = STATE_EXP_NUMBER;
  local_6cc = CHAR_NUMBER;
  local_6d0 = STATE_EXP_NUMBER;
  local_2f0 = &local_e8;
  std::pair<const_INumberJudger::CharType,_INumberJudger::State>::
  pair<INumberJudger::CharType,_INumberJudger::State,_true>(&local_6c8,&local_6cc,&local_6d0);
  local_6d4 = CHAR_SPACE;
  local_6d8 = STATE_END;
  std::pair<const_INumberJudger::CharType,_INumberJudger::State>::
  pair<INumberJudger::CharType,_INumberJudger::State,_true>(&local_6c0,&local_6d4,&local_6d8);
  local_6b8 = &local_6c8;
  local_6b0 = 2;
  std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>::allocator
            (&local_6db);
  __l_00._M_len = local_6b0;
  __l_00._M_array = local_6b8;
  std::
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  ::unordered_map(&local_6a8,__l_00,0,&local_6d9,&local_6da,&local_6db);
  std::
  pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
  ::pair<INumberJudger::State,_true>(&local_e8,&local_670,&local_6a8);
  local_6e0 = STATE_END;
  local_734 = CHAR_SPACE;
  local_738 = STATE_END;
  local_2f0 = &local_a8;
  std::pair<const_INumberJudger::CharType,_INumberJudger::State>::
  pair<INumberJudger::CharType,_INumberJudger::State,_true>(&local_730,&local_734,&local_738);
  local_728 = &local_730;
  local_720 = 1;
  std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>::allocator
            ((allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_> *)
             ((long)&len + 1));
  __l._M_len = local_720;
  __l._M_array = local_728;
  std::
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  ::unordered_map(&local_718,__l,0,(hasher *)((long)&len + 3),(key_equal *)((long)&len + 2),
                  (allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_> *)
                  ((long)&len + 1));
  std::
  pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
  ::pair<INumberJudger::State,_true>(&local_a8,&local_6e0,&local_718);
  len._0_1_ = 0;
  local_68 = &local_2e8;
  local_60 = (__buckets_ptr)0xa;
  std::
  allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>
  ::allocator((allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>
               *)((long)&st + 1));
  __l_09._M_len = (size_type)local_60;
  __l_09._M_array = local_68;
  std::
  unordered_map<INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>,_std::hash<INumberJudger::State>,_std::equal_to<INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>_>
  ::unordered_map((unordered_map<INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>,_std::hash<INumberJudger::State>,_std::equal_to<INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>_>
                   *)local_58,__l_09,0,(hasher *)((long)&st + 3),(key_equal *)((long)&st + 2),
                  (allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>
                   *)((long)&st + 1));
  std::
  allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>
  ::~allocator((allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>
                *)((long)&st + 1));
  local_820 = (pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
               *)&local_68;
  do {
    local_820 = local_820 + -1;
    std::
    pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>
    ::~pair(local_820);
  } while (local_820 != &local_2e8);
  std::
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  ::~unordered_map(&local_718);
  std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>::~allocator
            ((allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_> *)
             ((long)&len + 1));
  std::
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  ::~unordered_map(&local_6a8);
  std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>::~allocator
            (&local_6db);
  std::
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  ::~unordered_map(&local_648);
  std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>::~allocator
            (&local_66b);
  std::
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  ::~unordered_map(&local_5d8);
  std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>::~allocator
            (&local_60b);
  std::
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  ::~unordered_map(&local_568);
  std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>::~allocator
            (&local_59b);
  std::
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  ::~unordered_map(&local_508);
  std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>::~allocator
            (&local_52b);
  std::
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  ::~unordered_map(&local_498);
  std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>::~allocator
            (&local_4cb);
  std::
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  ::~unordered_map(&local_428);
  std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>::~allocator
            (&local_45b);
  std::
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  ::~unordered_map(&local_3b8);
  std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>::~allocator
            (&local_3eb);
  std::
  unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
  ::~unordered_map(&local_330);
  std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>::~allocator
            (&local_36b);
  i = std::__cxx11::string::length();
  typ = CHAR_NUMBER;
  local_74c = 0;
  do {
    if (i <= local_74c) {
      local_891 = true;
      if ((((typ != CHAR_POINT) && (local_891 = true, typ != CHAR_SIGN)) &&
          (local_891 = true, typ != CHAR_ILLEGAL)) && (local_891 = true, typ != 8)) {
        local_891 = typ == 9;
      }
      this_local._7_1_ = local_891;
LAB_0010fc87:
      std::
      unordered_map<INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>,_std::hash<INumberJudger::State>,_std::equal_to<INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>_>
      ::~unordered_map((unordered_map<INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>,_std::hash<INumberJudger::State>,_std::equal_to<INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>_>
                        *)local_58);
      return this_local._7_1_;
    }
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)s);
    local_750 = toCharType(this,*pcVar2);
    pmVar3 = std::
             unordered_map<INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>,_std::hash<INumberJudger::State>,_std::equal_to<INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>_>
             ::operator[]((unordered_map<INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>,_std::hash<INumberJudger::State>,_std::equal_to<INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>_>
                           *)local_58,&typ);
    local_758._M_cur =
         (__node_type *)
         std::
         unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
         ::find(pmVar3,&local_750);
    pmVar3 = std::
             unordered_map<INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>,_std::hash<INumberJudger::State>,_std::equal_to<INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>_>
             ::operator[]((unordered_map<INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>,_std::hash<INumberJudger::State>,_std::equal_to<INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>_>
                           *)local_58,&typ);
    local_760._M_cur =
         (__node_type *)
         std::
         unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
         ::end(pmVar3);
    bVar1 = std::__detail::operator==(&local_758,&local_760);
    if (bVar1) {
      this_local._7_1_ = false;
      goto LAB_0010fc87;
    }
    pmVar3 = std::
             unordered_map<INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>,_std::hash<INumberJudger::State>,_std::equal_to<INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>_>
             ::operator[]((unordered_map<INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>,_std::hash<INumberJudger::State>,_std::equal_to<INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>_>
                           *)local_58,&typ);
    pCVar4 = std::
             unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>
             ::operator[](pmVar3,&local_750);
    typ = *pCVar4;
    local_74c = local_74c + 1;
  } while( true );
}

Assistant:

bool INumberJudger::isNumber(std::string s)
{
	std::unordered_map<State, std::unordered_map<CharType, State>> transfer{
		{STATE_INITIAL, {
							{CHAR_SPACE, STATE_INITIAL},
							{CHAR_NUMBER, STATE_INTEGER},
							{CHAR_POINT, STATE_POINT_WITHOUT_INT},
							{CHAR_SIGN, STATE_INT_SIGN},
						}},
		{STATE_INT_SIGN, {
							 {CHAR_NUMBER, STATE_INTEGER},
							 {CHAR_POINT, STATE_POINT_WITHOUT_INT},
						 }},
		{STATE_INTEGER, {
							{CHAR_NUMBER, STATE_INTEGER},
							{CHAR_EXP, STATE_EXP},
							{CHAR_POINT, STATE_POINT},
							{CHAR_SPACE, STATE_END},
						}},
		{STATE_POINT, {
						  {CHAR_NUMBER, STATE_FRACTION},
						  {CHAR_EXP, STATE_EXP},
						  {CHAR_SPACE, STATE_END},
					  }},
		{STATE_POINT_WITHOUT_INT, {
									  {CHAR_NUMBER, STATE_FRACTION},
								  }},
		{STATE_FRACTION, {
							 {CHAR_NUMBER, STATE_FRACTION},
							 {CHAR_EXP, STATE_EXP},
							 {CHAR_SPACE, STATE_END},
						 }},
		{STATE_EXP, {
						{CHAR_NUMBER, STATE_EXP_NUMBER},
						{CHAR_SIGN, STATE_EXP_SIGN},
					}},
		{STATE_EXP_SIGN, {
							 {CHAR_NUMBER, STATE_EXP_NUMBER},
						 }},
		{STATE_EXP_NUMBER, {
							   {CHAR_NUMBER, STATE_EXP_NUMBER},
							   {CHAR_SPACE, STATE_END},
						   }},
		{STATE_END, {
						{CHAR_SPACE, STATE_END},
					}}};

	int len = s.length();
	State st = STATE_INITIAL;

	for (int i = 0; i < len; i++)
	{
		CharType typ = toCharType(s[i]);
		if (transfer[st].find(typ) == transfer[st].end())
		{
			return false;
		}
		else
		{
			st = transfer[st][typ];
		}
	}
	return st == STATE_INTEGER || st == STATE_POINT || st == STATE_FRACTION || st == STATE_EXP_NUMBER || st == STATE_END;
}